

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O3

uint us_internal_accept_poll_event(us_poll_t *p)

{
  uint64_t buf;
  uint local_10 [2];
  
  read(((int)p->state << 4) >> 4,local_10,8);
  return local_10[0];
}

Assistant:

unsigned int us_internal_accept_poll_event(struct us_poll_t *p) {
#ifdef LIBUS_USE_EPOLL
    int fd = us_poll_fd(p);
    uint64_t buf;
    int read_length = read(fd, &buf, 8);
    (void)read_length;
    return buf;
#else
    /* Kqueue has no underlying FD for timers or user events */
    return 0;
#endif
}